

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.h
# Opt level: O0

void __thiscall Assimp::LWS::NodeDesc::~NodeDesc(NodeDesc *this)

{
  NodeDesc *this_local;
  
  std::__cxx11::list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>::~list
            (&this->children);
  std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::~list
            (&this->channels);
  std::__cxx11::string::~string((string *)&this->path);
  return;
}

Assistant:

NodeDesc()
        :   type()
        ,   id()
        ,   number  (0)
        ,   parent  (0)
        ,   name    ("")
        ,   isPivotSet (false)
        ,   lightColor (1.f,1.f,1.f)
        ,   lightIntensity (1.f)
        ,   lightType (0)
        ,   lightFalloffType (0)
        ,   lightConeAngle (45.f)
        ,   lightEdgeAngle()
        ,   parent_resolved (NULL)
    {}